

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

pair<QHttpNetworkRequest,_QHttpNetworkReply_*> * __thiscall
QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::takeAt
          (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *__return_storage_ptr__,
          QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,qsizetype i)

{
  Data *pDVar1;
  pointer ppVar2;
  
  __return_storage_ptr__->second = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->first).d.d.ptr = (QHttpNetworkRequestPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  ppVar2 = data(this);
  QHttpNetworkRequest::QHttpNetworkRequest(&__return_storage_ptr__->first,&ppVar2[i].first);
  __return_storage_ptr__->second = ppVar2[i].second;
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,
               (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x0);
  }
  QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
            ((QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this,
             (this->d).ptr + i,1);
  return __return_storage_ptr__;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }